

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O0

void __thiscall FIX::SessionID::SessionID(SessionID *this,SessionID *param_1)

{
  SessionID *param_1_local;
  SessionID *this_local;
  
  BeginString::BeginString(&this->m_beginString,&param_1->m_beginString);
  SenderCompID::SenderCompID(&this->m_senderCompID,&param_1->m_senderCompID);
  TargetCompID::TargetCompID(&this->m_targetCompID,&param_1->m_targetCompID);
  std::__cxx11::string::string
            ((string *)&this->m_sessionQualifier,(string *)&param_1->m_sessionQualifier);
  this->m_isFIXT = (bool)(param_1->m_isFIXT & 1);
  std::__cxx11::string::string((string *)&this->m_frozenString,(string *)&param_1->m_frozenString);
  return;
}

Assistant:

SessionID() { toString(m_frozenString); }